

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O1

void __thiscall ninx::lexer::Reader::ignore_spaces_and_newline(Reader *this,int newline_limit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = std::istream::peek();
  iVar2 = isspace(iVar1);
  if (iVar2 != 0) {
    uVar3 = 0;
    do {
      if ((uint)newline_limit <= uVar3) {
        return;
      }
      std::istream::get();
      uVar3 = uVar3 + (iVar1 == 10);
      iVar1 = std::istream::peek();
      iVar2 = isspace(iVar1);
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void ninx::lexer::Reader::ignore_spaces_and_newline(int newline_limit) {
    int newline_count = 0;
    int current;
    while (isspace(current = this->stream.peek()) && (newline_count < newline_limit || newline_limit <0)) {
        this->stream.get();
        if (current == '\n') {
            newline_count++;
        }
    }
}